

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkreply_p.cpp
# Opt level: O3

void QHttpNetworkReply::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined4 local_2c;
  void *local_28;
  undefined4 *local_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 1:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_0020b6d9:
        *puVar3 = pIVar4;
        goto switchD_0020b5e0_default;
      }
      break;
    case 2:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_0020b6d9;
      }
      break;
    default:
      puVar3 = (undefined8 *)*_a;
      break;
    case 7:
    case 8:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
        goto LAB_0020b6d9;
      }
      break;
    case 0xc:
    case 0xe:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QHttpNetworkRequest>::metaType;
        goto LAB_0020b6d9;
      }
    }
    *puVar3 = 0;
    goto switchD_0020b5e0_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == encrypted && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == sslErrors && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == preSharedKeyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == socketStartedConnecting && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == requestSent && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == readyRead && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar1 == finishedWithError && lVar2 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar1 == headerChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar1 == dataReadProgress && lVar2 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar1 == dataSendProgress && lVar2 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    else if (pcVar1 == cacheCredentials && lVar2 == 0) {
      *(undefined4 *)*_a = 0xc;
    }
    else if (pcVar1 == proxyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 0xd;
    }
    else if (pcVar1 == authenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 0xe;
    }
    else if (pcVar1 == redirected && lVar2 == 0) {
      *(undefined4 *)*_a = 0xf;
    }
    goto switchD_0020b5e0_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0020b5e0_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 0;
LAB_0020b976:
      QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)0x0);
      return;
    }
    break;
  case 1:
    local_20 = (undefined4 *)_a[1];
    iVar5 = 1;
    goto LAB_0020b937;
  case 2:
    local_48 = *_a[1];
    iVar5 = 2;
    local_20 = (undefined4 *)&local_48;
    goto LAB_0020b937;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 3;
      goto LAB_0020b976;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 4;
      goto LAB_0020b976;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 5;
      goto LAB_0020b976;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 6;
      goto LAB_0020b976;
    }
    break;
  case 7:
    local_18 = (undefined1 *)_a[2];
    local_48 = (QArrayData *)CONCAT44(local_48._4_4_,*_a[1]);
    iVar5 = 7;
    local_20 = (undefined4 *)&local_48;
    goto LAB_0020b937;
  case 8:
    local_2c = *_a[1];
    local_38 = 0;
    local_48 = (QArrayData *)0x0;
    uStack_40 = 0;
    local_20 = &local_2c;
    local_28 = (void *)0x0;
    local_18 = (undefined1 *)&local_48;
    QMetaObject::activate(_o,&staticMetaObject,7,&local_28);
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    goto switchD_0020b5e0_default;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar5 = 9;
      goto LAB_0020b976;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      dataReadProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      dataSendProgress((QHttpNetworkReply *)_o,*_a[1],*_a[2]);
      return;
    }
    break;
  case 0xc:
    local_48 = *_a[2];
    iVar5 = 0xc;
    local_20 = (undefined4 *)_a[1];
    local_18 = (undefined1 *)&local_48;
    goto LAB_0020b937;
  case 0xd:
    local_48 = *_a[2];
    iVar5 = 0xd;
    local_20 = (undefined4 *)_a[1];
    local_18 = (undefined1 *)&local_48;
    goto LAB_0020b937;
  case 0xe:
    local_48 = *_a[2];
    iVar5 = 0xe;
    local_20 = (undefined4 *)_a[1];
    local_18 = (undefined1 *)&local_48;
LAB_0020b937:
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
switchD_0020b5e0_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      redirected((QHttpNetworkReply *)_o,(QUrl *)_a[1],*_a[2],*_a[3]);
      return;
    }
    break;
  default:
    goto switchD_0020b5e0_default;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReply::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkReply *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 2: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 3: _t->socketStartedConnecting(); break;
        case 4: _t->requestSent(); break;
        case 5: _t->readyRead(); break;
        case 6: _t->finished(); break;
        case 7: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 8: _t->finishedWithError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1]))); break;
        case 9: _t->headerChanged(); break;
        case 10: _t->dataReadProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 11: _t->dataSendProgress((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 12: _t->cacheCredentials((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 13: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 14: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QHttpNetworkRequest>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 15: _t->redirected((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        case 14:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QHttpNetworkRequest >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QList<QSslError> & )>(_a, &QHttpNetworkReply::sslErrors, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QHttpNetworkReply::preSharedKeyAuthenticationRequired, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::socketStartedConnecting, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::requestSent, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::readyRead, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::finished, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QHttpNetworkReply::finishedWithError, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)()>(_a, &QHttpNetworkReply::headerChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataReadProgress, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(qint64 , qint64 )>(_a, &QHttpNetworkReply::dataSendProgress, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::cacheCredentials, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QHttpNetworkReply::proxyAuthenticationRequired, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QHttpNetworkRequest & , QAuthenticator * )>(_a, &QHttpNetworkReply::authenticationRequired, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QHttpNetworkReply::*)(const QUrl & , int , int )>(_a, &QHttpNetworkReply::redirected, 15))
            return;
    }
}